

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<double,_1,_4>::Matrix(Matrix<double,_1,_4> *this)

{
  int col;
  long lVar1;
  uint uVar2;
  
  Vector<tcu::Vector<double,_1>,_4>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar2 = 0x3ff00000;
    if (lVar1 != 0) {
      uVar2 = 0;
    }
    (this->m_data).m_data[lVar1].m_data[0] = (double)((ulong)uVar2 << 0x20);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}